

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table_impl.h
# Opt level: O0

ht_item_t_conflict5
ht_insert(hash_table_t *ht,void *key,size_t len,ht_item_t_conflict5 new_item,int mode)

{
  void *pvVar1;
  fb_value_t *item_00;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  bool bVar5;
  undefined8 *local_70;
  ht_item_t_conflict5 *vacant;
  ht_item_t_conflict5 item;
  size_t k;
  size_t j;
  size_t i;
  size_t N;
  ht_item_t_conflict5 *T;
  int mode_local;
  ht_item_t_conflict5 new_item_local;
  size_t len_local;
  void *key_local;
  hash_table_t *ht_local;
  
  local_70 = (undefined8 *)0x0;
  if (new_item == (ht_item_t_conflict5)0x0) {
    __assert_fail("new_item != HT_MISSING",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/external/hash/hash_table_impl.h"
                  ,0x73,"ht_item_t ht_insert(hash_table_t *, const void *, size_t, ht_item_t, int)")
    ;
  }
  if (new_item == (ht_item_t_conflict5)&DAT_00000002) {
    __assert_fail("new_item != HT_DELETED",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/external/hash/hash_table_impl.h"
                  ,0x74,"ht_item_t ht_insert(hash_table_t *, const void *, size_t, ht_item_t, int)")
    ;
  }
  if (new_item == (ht_item_t_conflict5)&DAT_00000001) {
    __assert_fail("new_item != HT_NOMEM",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/external/hash/hash_table_impl.h"
                  ,0x75,"ht_item_t ht_insert(hash_table_t *, const void *, size_t, ht_item_t, int)")
    ;
  }
  if ((ht->buckets * 0xb3 >> 8 <= ht->count) && (iVar2 = ht_resize(ht,ht->count << 1), iVar2 != 0))
  {
    fprintf(_stderr,"aborting on panic: %s\n","hash table failed to allocate memory during resize");
    exit(1);
  }
  pvVar1 = ht->table;
  uVar3 = ht->buckets - 1;
  sVar4 = value_hash_function(key,len);
  j = 0;
  k = sVar4 & uVar3;
  if ((mode == 2) || (mode == 3)) {
    ht->count = ht->count + 1;
    while( true ) {
      bVar5 = false;
      if (*(long *)((long)pvVar1 + k * 8) != 0) {
        bVar5 = *(long *)((long)pvVar1 + k * 8) != 2;
      }
      if (!bVar5) break;
      j = j + 1;
      k = sVar4 + j & uVar3;
    }
    *(ht_item_t_conflict5 *)((long)pvVar1 + k * 8) = new_item;
  }
  else {
    while (item_00 = *(fb_value_t **)((long)pvVar1 + k * 8), item_00 != (fb_value_t *)0x0) {
      if (item_00 == (fb_value_t *)&DAT_00000002) {
        if (local_70 == (undefined8 *)0x0) {
          local_70 = (undefined8 *)((long)pvVar1 + k * 8);
        }
      }
      else {
        iVar2 = ht_match(key,len,item_00);
        if (iVar2 != 0) {
          if (mode != 0) {
            return item_00;
          }
          *(ht_item_t_conflict5 *)((long)pvVar1 + k * 8) = new_item;
          return item_00;
        }
      }
      j = j + 1;
      k = sVar4 + j & uVar3;
    }
    if (local_70 == (undefined8 *)0x0) {
      local_70 = (undefined8 *)((long)pvVar1 + k * 8);
    }
    ht->count = ht->count + 1;
    *local_70 = new_item;
  }
  return (ht_item_t_conflict5)0x0;
}

Assistant:

static ht_item_t ht_insert(hash_table_t *ht,
        const void *key, size_t len, ht_item_t new_item, int mode)
{
    ht_item_t *T;
    size_t N, i, j, k;
    ht_item_t item, *vacant = 0;

    assert(new_item != HT_MISSING);
    assert(new_item != HT_DELETED);
    assert(new_item != HT_NOMEM);

    if (ht->count >= ht->buckets * (HT_LOAD_FACTOR_FRAC) / 256) {
        if (ht_resize(ht, ht->count * 2)) {
            HT_PANIC("hash table failed to allocate memory during resize");
            return HT_NOMEM;
        }
    }
    T = ht->table;
    N = ht->buckets - 1;
    k = HT_HASH_FUNCTION(key, len);
    i = 0;
    j = HT_PROBE(k, i, N);
    if (mode == ht_unique || mode == ht_multi) {
        ++ht->count;
        while (T[j] && T[j] != HT_DELETED) {
            ++i;
            j = HT_PROBE(k, i, N);
        }
        T[j] = new_item;
        return 0;
    }
    while ((item = T[j])) {
        if (item == HT_DELETED) {
            if (vacant == 0) {
                /*
                 * If a tombstone was found, use the first available,
                 * but continue search for possible match.
                 */
                vacant = &T[j];
            }
        } else if (ht_match(key, len, item)) {
            if (mode == ht_replace) {
                T[j] = new_item;
            }
            return item;
        }
        ++i;
        j = HT_PROBE(k, i, N);
    }
    if (vacant == 0) {
        vacant = &T[j];
    }
    ++ht->count;
    *vacant = new_item;
    return 0;
}